

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool loadfirstvalue(roaring_uint32_iterator_t *newit)

{
  uint8_t uVar1;
  ulong uVar2;
  int iVar3;
  _Bool _Var4;
  run_container_t *rc;
  array_container_t *ac;
  uint64_t word;
  uint32_t wordindex;
  bitset_container_t *bc;
  roaring_uint32_iterator_t *newit_local;
  
  _Var4 = iter_new_container_partial_init(newit);
  if (_Var4) {
    uVar1 = newit->typecode;
    if (uVar1 == '\x01') {
      word._4_4_ = 0;
      while (uVar2 = *(ulong *)(*(long *)((long)newit->container + 8) + (ulong)word._4_4_ * 8),
            uVar2 == 0) {
        word._4_4_ = word._4_4_ + 1;
      }
      iVar3 = 0;
      for (; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x8000000000000000) {
        iVar3 = iVar3 + 1;
      }
      newit->in_container_index = word._4_4_ * 0x40 + iVar3;
      newit->current_value = newit->highbits | newit->in_container_index;
    }
    else if (uVar1 == '\x02') {
      newit->current_value = newit->highbits | (uint)**(ushort **)((long)newit->container + 8);
    }
    else {
      if (uVar1 != '\x03') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x4060,"_Bool loadfirstvalue(roaring_uint32_iterator_t *)");
      }
      newit->current_value = newit->highbits | (uint)**(ushort **)((long)newit->container + 8);
    }
    newit_local._7_1_ = true;
  }
  else {
    newit_local._7_1_ = (_Bool)(newit->has_value & 1);
  }
  return newit_local._7_1_;
}

Assistant:

static bool loadfirstvalue(roaring_uint32_iterator_t *newit) {
    if (!iter_new_container_partial_init(newit))
        return newit->has_value;

    switch (newit->typecode) {
        case BITSET_CONTAINER_TYPE: {
            const bitset_container_t *bc = const_CAST_bitset(newit->container);

            uint32_t wordindex = 0;
            uint64_t word;
            while ((word = bc->words[wordindex]) == 0) {
                wordindex++;  // advance
            }
            // here "word" is non-zero
            newit->in_container_index = wordindex * 64 + __builtin_ctzll(word);
            newit->current_value = newit->highbits | newit->in_container_index;
            break; }

        case ARRAY_CONTAINER_TYPE: {
            const array_container_t *ac = const_CAST_array(newit->container);
            newit->current_value = newit->highbits | ac->array[0];
            break; }

        case RUN_CONTAINER_TYPE: {
            const run_container_t *rc = const_CAST_run(newit->container);
            newit->current_value = newit->highbits | rc->runs[0].value;
            break; }

        default:
            // if this ever happens, bug!
            assert(false);
    }  // switch (typecode)
    return true;
}